

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall
re2::RE2::ProgramFanout
          (RE2 *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram)

{
  bool bVar1;
  int max_size;
  pointer pIVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  byte bVar5;
  undefined1 local_78 [20];
  int bucket;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  local_60;
  iterator i;
  undefined1 local_48 [8];
  SparseArray<int> fanout;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram_local;
  RE2 *this_local;
  
  if (this->prog_ == (Prog *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    fanout.dense_.
    super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)histogram;
    max_size = Prog::size(this->prog_);
    SparseArray<int>::SparseArray((SparseArray<int> *)local_48,max_size);
    Prog::Fanout(this->prog_,(SparseArray<int> *)local_48);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               fanout.dense_.
               super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_60._M_current = (IndexValue *)SparseArray<int>::begin((SparseArray<int> *)local_48);
    while( true ) {
      register0x00000000 = SparseArray<int>::end((SparseArray<int> *)local_48);
      bVar1 = __gnu_cxx::operator!=
                        (&local_60,
                         (__normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
                          *)(local_78 + 0x10));
      if (!bVar1) break;
      local_78._12_4_ = 0;
      while( true ) {
        bVar5 = (byte)local_78._12_4_;
        pIVar2 = __gnu_cxx::
                 __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
                 ::operator->(&local_60);
        if (pIVar2->second <= 1 << (bVar5 & 0x1f)) break;
        local_78._12_4_ = local_78._12_4_ + 1;
      }
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)fanout.dense_.
                             super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (key_type *)(local_78 + 0xc));
      *pmVar3 = *pmVar3 + 1;
      __gnu_cxx::
      __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
      ::operator++(&local_60);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rbegin
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               local_78);
    ppVar4 = std::reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>::operator->
                       ((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_> *)
                        local_78);
    this_local._4_4_ = ppVar4->first;
    SparseArray<int>::~SparseArray((SparseArray<int> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

int RE2::ProgramFanout(map<int, int>* histogram) const {
  if (prog_ == NULL)
    return -1;
  SparseArray<int> fanout(prog_->size());
  prog_->Fanout(&fanout);
  histogram->clear();
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    // TODO(junyer): Optimise this?
    int bucket = 0;
    while (1 << bucket < i->second) {
      bucket++;
    }
    (*histogram)[bucket]++;
  }
  return histogram->rbegin()->first;
}